

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

BeagleResourceList * beagleGetResourceList(void)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  BeagleResource *pBVar4;
  reference ppPVar5;
  pointer paVar6;
  reference paVar7;
  __enable_if_t<is_constructible<value_type,_pair<int,_int>_>::value,_pair<iterator,_bool>_> _Var8;
  int i;
  bool rsrcExists;
  int prev_rI;
  iterator r_iter;
  list<BeagleResource,_std::allocator<BeagleResource>_> rList;
  int rI;
  iterator plugin_iter;
  list<BeagleResource,_std::allocator<BeagleResource>_> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  _Rb_tree_iterator<std::pair<const_int,_int>_> in_stack_ffffffffffffff48;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_ffffffffffffff50;
  list<BeagleResource,_std::allocator<BeagleResource>_> *in_stack_ffffffffffffff78;
  list<BeagleResource,_std::allocator<BeagleResource>_> *in_stack_ffffffffffffff80;
  int local_74;
  pair<int,_int> local_70;
  int local_68;
  byte local_61;
  _Self local_60;
  int local_54;
  _Self local_50 [4];
  _Self local_30;
  _List_node_base *local_28;
  int local_1c;
  _List_node_base *local_18;
  _Self local_10;
  _Self local_8;
  
  if (plugins_abi_cxx11_ ==
      (list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *)0x0) {
    beagleLoadPlugins();
  }
  if (rsrcList == (BeagleResourceList *)0x0) {
    rsrcList = (BeagleResourceList *)malloc(0x10);
    rsrcList->length = 0;
    local_8._M_node =
         (_List_node_base *)
         std::__cxx11::list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>::
         begin((list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *)
               in_stack_ffffffffffffff38);
    while( true ) {
      local_10._M_node =
           (_List_node_base *)
           std::__cxx11::list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>::
           end((list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *)
               in_stack_ffffffffffffff38);
      bVar1 = std::operator!=(&local_8,&local_10);
      if (!bVar1) break;
      ppPVar5 = std::_List_iterator<beagle::plugin::Plugin_*>::operator*
                          ((_List_iterator<beagle::plugin::Plugin_*> *)0x11fa28);
      (*(*ppPVar5)->_vptr_Plugin[3])();
      sVar3 = std::__cxx11::list<BeagleResource,_std::allocator<BeagleResource>_>::size
                        ((list<BeagleResource,_std::allocator<BeagleResource>_> *)
                         CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      rsrcList->length = rsrcList->length + (int)sVar3;
      local_18 = (_List_node_base *)
                 std::_List_iterator<beagle::plugin::Plugin_*>::operator++(&local_8,0);
    }
    pBVar4 = (BeagleResource *)malloc((long)rsrcList->length << 5);
    rsrcList->list = pBVar4;
    local_1c = 0;
    local_28 = (_List_node_base *)
               std::__cxx11::
               list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>::begin
                         ((list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>
                           *)in_stack_ffffffffffffff38);
    local_8._M_node = local_28;
    while( true ) {
      local_30._M_node =
           (_List_node_base *)
           std::__cxx11::list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>::
           end((list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *)
               in_stack_ffffffffffffff38);
      bVar1 = std::operator!=(&local_8,&local_30);
      if (!bVar1) break;
      ppPVar5 = std::_List_iterator<beagle::plugin::Plugin_*>::operator*
                          ((_List_iterator<beagle::plugin::Plugin_*> *)0x11fb04);
      (*(*ppPVar5)->_vptr_Plugin[3])();
      std::__cxx11::list<BeagleResource,_std::allocator<BeagleResource>_>::list
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_50[0]._M_node =
           (_List_node_base *)
           std::__cxx11::list<BeagleResource,_std::allocator<BeagleResource>_>::begin
                     (in_stack_ffffffffffffff38);
      local_54 = local_1c;
      while( true ) {
        local_60._M_node =
             (_List_node_base *)
             std::__cxx11::list<BeagleResource,_std::allocator<BeagleResource>_>::end
                       (in_stack_ffffffffffffff38);
        bVar1 = std::operator!=(local_50,&local_60);
        if (!bVar1) break;
        local_61 = 0;
        for (local_68 = 0; local_68 < local_54; local_68 = local_68 + 1) {
          in_stack_ffffffffffffff50 =
               (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               rsrcList->list[local_68].name;
          paVar6 = std::_List_iterator<BeagleResource>::operator->
                             ((_List_iterator<BeagleResource> *)0x11fbaa);
          iVar2 = strcmp((char *)in_stack_ffffffffffffff50,paVar6->name);
          if (iVar2 == 0) {
            if ((local_61 & 1) == 0) {
              local_61 = 1;
              rsrcList->length = rsrcList->length + -1;
            }
            paVar6 = std::_List_iterator<BeagleResource>::operator->
                               ((_List_iterator<BeagleResource> *)0x11fbe5);
            rsrcList->list[local_68].supportFlags =
                 paVar6->supportFlags | rsrcList->list[local_68].supportFlags;
          }
        }
        if ((local_61 & 1) == 0) {
          local_74 = local_1c - local_54;
          std::pair<int,_int>::pair<int_&,_int,_true>(&local_70,&local_1c,&local_74);
          _Var8 = std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
                  insert<std::pair<int,int>>
                            (in_stack_ffffffffffffff50,
                             (pair<int,_int> *)in_stack_ffffffffffffff48._M_node);
          in_stack_ffffffffffffff48 = _Var8.first._M_node;
          paVar7 = std::_List_iterator<BeagleResource>::operator*
                             ((_List_iterator<BeagleResource> *)0x11fc89);
          pBVar4 = rsrcList->list + local_1c;
          pBVar4->name = paVar7->name;
          pBVar4->description = paVar7->description;
          pBVar4->supportFlags = paVar7->supportFlags;
          pBVar4->requiredFlags = paVar7->requiredFlags;
          local_1c = local_1c + 1;
        }
        std::_List_iterator<BeagleResource>::operator++(local_50,0);
      }
      std::__cxx11::list<BeagleResource,_std::allocator<BeagleResource>_>::~list
                ((list<BeagleResource,_std::allocator<BeagleResource>_> *)0x11fd18);
      std::_List_iterator<beagle::plugin::Plugin_*>::operator++(&local_8,0);
    }
  }
  return rsrcList;
}

Assistant:

BeagleResourceList* beagleGetResourceList() {
    // plugins must be loaded before resources
    if (plugins==NULL)
        beagleLoadPlugins();

    if (rsrcList == NULL) {
        // count the total resources across plugins
        rsrcList = (BeagleResourceList*) malloc(sizeof(BeagleResourceList));
        rsrcList->length = 0;
        std::list<beagle::plugin::Plugin*>::iterator plugin_iter = plugins->begin();
        for(; plugin_iter != plugins->end(); plugin_iter++ ){
            rsrcList->length += (*plugin_iter)->getBeagleResources().size();
        }

        // allocate space for a complete list of resources
        rsrcList->list = (BeagleResource*) malloc(sizeof(BeagleResource) * rsrcList->length);

        // copy in resource lists from each plugin
        int rI=0;
        for(plugin_iter = plugins->begin(); plugin_iter != plugins->end(); plugin_iter++ ){
            std::list<BeagleResource> rList = (*plugin_iter)->getBeagleResources();
            std::list<BeagleResource>::iterator r_iter = rList.begin();
            int prev_rI = rI;
            for(; r_iter != rList.end(); r_iter++){
                bool rsrcExists = false;
                for(int i=0; i<prev_rI; i++){
                    if (strcmp(rsrcList->list[i].name, r_iter->name) == 0) {
                        if (!rsrcExists) {
                            rsrcExists = true;
                            rsrcList->length--;
                        }
                        rsrcList->list[i].supportFlags |= r_iter->supportFlags;
                    }
                }

                if (!rsrcExists) {
                    ResourceMap.insert(std::pair<int, int>(rI, (rI - prev_rI)));
                    rsrcList->list[rI++] = *r_iter;
                }
            }
        }
    }
    return rsrcList;
}